

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

void __thiscall
Fl_Check_Browser::item_draw(Fl_Check_Browser *this,void *v,int X,int Y,int param_4,int param_5)

{
  char *str;
  Fl_Fontsize fsize;
  int iVar1;
  Fl_Fontsize FVar2;
  int x;
  int iVar3;
  Fl_Fontsize FVar4;
  Fl_Fontsize FVar5;
  Fl_Fontsize FVar6;
  int iVar7;
  int iVar8;
  Fl_Font face;
  Fl_Color FVar9;
  undefined4 local_78;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 local_58;
  int n;
  int ty;
  int d2;
  int d1;
  int tw;
  int tx;
  int cy;
  Fl_Color col;
  int tsize;
  char *s;
  cb_item *i;
  int param_5_local;
  int param_4_local;
  int Y_local;
  int X_local;
  void *v_local;
  Fl_Check_Browser *this_local;
  
  str = *(char **)((long)v + 0x18);
  fsize = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar1 == 0) {
    FVar9 = Fl_Browser_::textcolor(&this->super_Fl_Browser_);
    local_6c = fl_inactive(FVar9);
  }
  else {
    local_6c = Fl_Browser_::textcolor(&this->super_Fl_Browser_);
  }
  tx = local_6c;
  FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  iVar1 = Y + ((fsize + 1) - (FVar2 + -2)) / 2;
  x = X + 2;
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar3 == 0) {
    local_78 = fl_inactive(0);
  }
  else {
    local_78 = 0;
  }
  fl_color(local_78);
  FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  FVar4 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  FVar5 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  FVar6 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  fl_loop(x,iVar1,x,iVar1 + FVar2 + -2,x + FVar4 + -2,iVar1 + FVar5 + -2,x + FVar6 + -2,iVar1);
  if (*(char *)((long)v + 0x10) != '\0') {
    iVar3 = X + 5;
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    iVar7 = FVar2 + -6;
    iVar8 = iVar7 / 3;
    FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    local_58 = ((iVar1 + (FVar2 + -2 + (iVar7 - iVar8)) / 2) - iVar8) + -2;
    for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
      fl_line(iVar3,local_58,iVar3 + iVar8,local_58 + iVar8);
      fl_line(iVar3 + iVar8,local_58 + iVar8,iVar3 + iVar7 + -1,
              ((local_58 + iVar8) - (iVar7 - iVar8)) + 1);
      local_58 = local_58 + 1;
    }
  }
  face = Fl_Browser_::textfont(&this->super_Fl_Browser_);
  fl_font(face,fsize);
  if (*(char *)((long)v + 0x11) != '\0') {
    FVar9 = Fl_Widget::selection_color((Fl_Widget *)this);
    tx = fl_contrast(local_6c,FVar9);
  }
  fl_color(tx);
  FVar2 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  fl_draw(str,x + FVar2 + 6,Y + fsize + -1);
  return;
}

Assistant:

void Fl_Check_Browser::item_draw(void *v, int X, int Y, int, int) const {
	cb_item *i = (cb_item *)v;
	char *s = i->text;
	int tsize = textsize();
	Fl_Color col = active_r() ? textcolor() : fl_inactive(textcolor());
	int cy = Y + (tsize + 1 - CHECK_SIZE) / 2;
	X += 2;

	fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
	fl_loop(X, cy, X, cy + CHECK_SIZE,
	        X + CHECK_SIZE, cy + CHECK_SIZE, X + CHECK_SIZE, cy);
	if (i->checked) {
	  int tx = X + 3;
	  int tw = CHECK_SIZE - 4;
	  int d1 = tw/3;
	  int d2 = tw-d1;
	  int ty = cy + (CHECK_SIZE+d2)/2-d1-2;
	  for (int n = 0; n < 3; n++, ty++) {
	    fl_line(tx, ty, tx+d1, ty+d1);
	    fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	  }
	}
	fl_font(textfont(), tsize);
	if (i->selected) {
		col = fl_contrast(col, selection_color());
	}
	fl_color(col);
	fl_draw(s, X + CHECK_SIZE + 8, Y + tsize - 1);
}